

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_signal_set.hpp
# Opt level: O3

void __thiscall
asio::basic_signal_set<asio::any_io_executor>::add
          (basic_signal_set<asio::any_io_executor> *this,int signal_number)

{
  error_code __ec;
  error_code ec;
  error_code local_48;
  system_error local_38 [32];
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  detail::signal_set_service::add
            ((this->impl_).service_,&(this->impl_).implementation_,signal_number,&local_48);
  __ec._4_4_ = 0;
  __ec._M_value = local_48._M_value;
  if (local_48._M_value != 0) {
    __ec._M_cat = local_48._M_cat;
    std::system_error::system_error(local_38,__ec,"add");
    detail::throw_exception<std::system_error>(local_38);
    std::system_error::~system_error(local_38);
  }
  return;
}

Assistant:

void add(int signal_number)
  {
    asio::error_code ec;
    impl_.get_service().add(impl_.get_implementation(), signal_number, ec);
    asio::detail::throw_error(ec, "add");
  }